

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O2

Matrix2f operator*(float f,Matrix2f *m)

{
  int i;
  long lVar1;
  int j;
  long lVar2;
  long in_RSI;
  float fVar3;
  ulong extraout_XMM0_Qa;
  Matrix2f MVar5;
  ulong uVar4;
  
  Matrix2f::Matrix2f(m,0.0);
  uVar4 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      fVar3 = *(float *)(in_RSI + lVar2 * 8) * f;
      uVar4 = (ulong)(uint)fVar3;
      *(float *)((long)m + lVar2 * 2 * 4) = fVar3;
    }
    m = (Matrix2f *)((long)m + 4);
    in_RSI = in_RSI + 4;
  }
  MVar5.m_elements[2] = f;
  MVar5.m_elements[0] = (float)(int)uVar4;
  MVar5.m_elements[1] = (float)(int)(uVar4 >> 0x20);
  MVar5.m_elements[3] = 0.0;
  return (Matrix2f)MVar5.m_elements;
}

Assistant:

Matrix2f operator * ( float f, const Matrix2f& m )
{
	Matrix2f output;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			output( i, j ) = f * m( i, j );
		}
	}

	return output;
}